

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opbehavior.cc
# Opt level: O0

uintb __thiscall
OpBehaviorIntSright::evaluateBinary
          (OpBehaviorIntSright *this,int4 sizeout,int4 sizein,uintb in1,uintb in2)

{
  bool bVar1;
  uintb uVar2;
  byte bVar3;
  uintb mask;
  uintb res;
  uintb in2_local;
  uintb in1_local;
  int4 sizein_local;
  int4 sizeout_local;
  OpBehaviorIntSright *this_local;
  
  bVar1 = signbit_negative(in1,sizein);
  bVar3 = (byte)in2;
  if (bVar1) {
    uVar2 = calc_mask(sizein);
    mask = uVar2 >> (bVar3 & 0x3f) ^ uVar2 | in1 >> (bVar3 & 0x3f);
  }
  else {
    mask = in1 >> (bVar3 & 0x3f);
  }
  return mask;
}

Assistant:

uintb OpBehaviorIntSright::evaluateBinary(int4 sizeout,int4 sizein,uintb in1,uintb in2) const

{
  uintb res;
  if (signbit_negative(in1,sizein)) {
    res = in1 >> in2;
    uintb mask = calc_mask(sizein);
    mask = (mask >> in2) ^ mask;
    res |= mask;
  }
  else {
    res = in1 >> in2;
  }
  return res;
}